

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixNormalize(Matrix mat)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Matrix mat_00;
  Matrix *in_RDI;
  float fVar8;
  undefined1 auVar9 [16];
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  
  mat_00._8_8_ = in_stack_00000010;
  mat_00._0_8_ = in_stack_00000008;
  mat_00._16_8_ = in_stack_00000018;
  mat_00._24_8_ = in_stack_00000020;
  mat_00._32_8_ = in_stack_00000028;
  mat_00._40_8_ = in_stack_00000030;
  mat_00._48_8_ = in_stack_00000038;
  mat_00._56_8_ = in_stack_00000040;
  fVar8 = MatrixDeterminant(mat_00);
  auVar4._8_8_ = in_stack_00000010;
  auVar4._0_8_ = in_stack_00000008;
  auVar9._4_4_ = fVar8;
  auVar9._0_4_ = fVar8;
  auVar9._8_4_ = fVar8;
  auVar9._12_4_ = fVar8;
  auVar9 = divps(auVar4,auVar9);
  in_RDI->m0 = (float)auVar9._0_4_;
  in_RDI->m4 = (float)auVar9._4_4_;
  in_RDI->m8 = (float)auVar9._8_4_;
  in_RDI->m12 = (float)auVar9._12_4_;
  auVar5._8_8_ = in_stack_00000020;
  auVar5._0_8_ = in_stack_00000018;
  auVar1._4_4_ = fVar8;
  auVar1._0_4_ = fVar8;
  auVar1._8_4_ = fVar8;
  auVar1._12_4_ = fVar8;
  auVar9 = divps(auVar5,auVar1);
  in_RDI->m1 = (float)auVar9._0_4_;
  in_RDI->m5 = (float)auVar9._4_4_;
  in_RDI->m9 = (float)auVar9._8_4_;
  in_RDI->m13 = (float)auVar9._12_4_;
  auVar6._8_8_ = in_stack_00000030;
  auVar6._0_8_ = in_stack_00000028;
  auVar2._4_4_ = fVar8;
  auVar2._0_4_ = fVar8;
  auVar2._8_4_ = fVar8;
  auVar2._12_4_ = fVar8;
  auVar9 = divps(auVar6,auVar2);
  in_RDI->m2 = (float)auVar9._0_4_;
  in_RDI->m6 = (float)auVar9._4_4_;
  in_RDI->m10 = (float)auVar9._8_4_;
  in_RDI->m14 = (float)auVar9._12_4_;
  auVar7._8_8_ = in_stack_00000040;
  auVar7._0_8_ = in_stack_00000038;
  auVar3._4_4_ = fVar8;
  auVar3._0_4_ = fVar8;
  auVar3._8_4_ = fVar8;
  auVar3._12_4_ = fVar8;
  auVar9 = divps(auVar7,auVar3);
  in_RDI->m3 = (float)auVar9._0_4_;
  in_RDI->m7 = (float)auVar9._4_4_;
  in_RDI->m11 = (float)auVar9._8_4_;
  in_RDI->m15 = (float)auVar9._12_4_;
  return in_RDI;
}

Assistant:

RMDEF Matrix MatrixNormalize(Matrix mat)
{
    Matrix result = { 0 };

    float det = MatrixDeterminant(mat);

    result.m0 = mat.m0/det;
    result.m1 = mat.m1/det;
    result.m2 = mat.m2/det;
    result.m3 = mat.m3/det;
    result.m4 = mat.m4/det;
    result.m5 = mat.m5/det;
    result.m6 = mat.m6/det;
    result.m7 = mat.m7/det;
    result.m8 = mat.m8/det;
    result.m9 = mat.m9/det;
    result.m10 = mat.m10/det;
    result.m11 = mat.m11/det;
    result.m12 = mat.m12/det;
    result.m13 = mat.m13/det;
    result.m14 = mat.m14/det;
    result.m15 = mat.m15/det;

    return result;
}